

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPoolPrivate::clear(QThreadPoolPrivate *this)

{
  undefined8 this_00;
  value_type this_01;
  QRunnable *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._0_8_ = &this->mutex;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
  local_40[8] = true;
  while ((this->queue).d.size != 0) {
    this_01 = QList<QueuePage_*>::takeLast(&this->queue);
    while (this_01->m_firstIndex <= this_01->m_lastIndex) {
      pQVar1 = QueuePage::pop(this_01);
      this_00 = local_40._0_8_;
      if ((pQVar1 != (QRunnable *)0x0) && (pQVar1->m_autoDelete == true)) {
        QBasicMutex::unlock((QBasicMutex *)local_40._0_8_);
        (*pQVar1->_vptr_QRunnable[2])(pQVar1);
        QBasicMutex::lock((QBasicMutex *)this_00);
        local_40[8] = true;
      }
    }
    operator_delete(this_01,0x810);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPoolPrivate::clear()
{
    QMutexLocker locker(&mutex);
    while (!queue.isEmpty()) {
        auto *page = queue.takeLast();
        while (!page->isFinished()) {
            QRunnable *r = page->pop();
            if (r && r->autoDelete()) {
                locker.unlock();
                delete r;
                locker.relock();
            }
        }
        delete page;
    }
}